

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O2

bool __thiscall
rapidjson::
Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
::WriteNull(Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
            *this)

{
  char *pcVar1;
  
  GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Reserve(this->os_,4);
  pcVar1 = (this->os_->stack_).stackTop_;
  (this->os_->stack_).stackTop_ = pcVar1 + 1;
  *pcVar1 = 'n';
  pcVar1 = (this->os_->stack_).stackTop_;
  (this->os_->stack_).stackTop_ = pcVar1 + 1;
  *pcVar1 = 'u';
  pcVar1 = (this->os_->stack_).stackTop_;
  (this->os_->stack_).stackTop_ = pcVar1 + 1;
  *pcVar1 = 'l';
  pcVar1 = (this->os_->stack_).stackTop_;
  (this->os_->stack_).stackTop_ = pcVar1 + 1;
  *pcVar1 = 'l';
  return true;
}

Assistant:

bool WriteNull()  {
        PutReserve(*os_, 4);
        PutUnsafe(*os_, 'n'); PutUnsafe(*os_, 'u'); PutUnsafe(*os_, 'l'); PutUnsafe(*os_, 'l'); return true;
    }